

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O3

int hydro_kx_aead_decrypt(hydro_kx_state *state,uint8_t *m,uint8_t *c,size_t clen)

{
  ulong __n;
  uint *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  uchar *dst_1;
  int iVar11;
  ulong uVar12;
  ulong __n_00;
  ushort uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  uint32_t *b1;
  uint32_t int_state [12];
  uint32_t pub_mac [4];
  uint8_t k [32];
  uint local_98 [4];
  uint local_88 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  uint8_t local_58 [40];
  undefined1 auVar15 [16];
  
  local_68 = *(undefined8 *)c;
  uStack_60 = *(undefined8 *)(c + 8);
  __n = clen - 0x10;
  hydro_kx_aead_init((uint8_t *)local_98,local_58,state);
  hydro_hash_update(&state->h_st,c,clen);
  if (__n < 0x10) {
    uVar12 = 0;
  }
  else {
    uVar12 = __n >> 4;
    lVar10 = 0;
    do {
      puVar9 = (uint *)(c + lVar10 + 0x10);
      uVar8 = puVar9[1];
      uVar6 = puVar9[2];
      uVar7 = puVar9[3];
      puVar1 = (uint *)(m + lVar10);
      *puVar1 = local_98[0] ^ *puVar9;
      puVar1[1] = local_98[1] ^ uVar8;
      puVar1[2] = local_98[2] ^ uVar6;
      puVar1[3] = local_98[3] ^ uVar7;
      uVar3 = *(undefined8 *)(c + lVar10 + 0x10);
      uVar4 = *(undefined8 *)(c + lVar10 + 0x10 + 8);
      local_98[0] = (uint)uVar3;
      local_98[1] = (uint)((ulong)uVar3 >> 0x20);
      local_98[2] = (uint)uVar4;
      local_98[3] = (uint)((ulong)uVar4 >> 0x20);
      gimli_core_u8((uint8_t *)local_98,'\x02');
      lVar10 = lVar10 + 0x10;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    uVar12 = __n & 0xfffffffffffffff0;
  }
  __n_00 = clen & 0xf;
  puVar9 = local_98;
  if (__n_00 != 0) {
    auVar16 = vpbroadcastq_avx512f();
    uVar3 = vpcmpuq_avx512f(auVar16,_DAT_00109800,5);
    uVar4 = vpcmpuq_avx512f(auVar16,_DAT_00109840,5);
    bVar5 = (byte)uVar4;
    uVar13 = CONCAT11(bVar5,(byte)uVar3);
    auVar14 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(c + uVar12 + 0x10));
    auVar15[1] = ((byte)(uVar13 >> 1) & 1) * auVar14[1];
    auVar15[0] = ((byte)uVar3 & 1) * auVar14[0];
    auVar15[2] = ((byte)(uVar13 >> 2) & 1) * auVar14[2];
    auVar15[3] = ((byte)(uVar13 >> 3) & 1) * auVar14[3];
    auVar15[4] = ((byte)(uVar13 >> 4) & 1) * auVar14[4];
    auVar15[5] = ((byte)(uVar13 >> 5) & 1) * auVar14[5];
    auVar15[6] = ((byte)(uVar13 >> 6) & 1) * auVar14[6];
    auVar15[7] = ((byte)(uVar13 >> 7) & 1) * auVar14[7];
    auVar15[8] = (bVar5 & 1) * auVar14[8];
    auVar15[9] = (bVar5 >> 1 & 1) * auVar14[9];
    auVar15[10] = (bVar5 >> 2 & 1) * auVar14[10];
    auVar15[0xb] = (bVar5 >> 3 & 1) * auVar14[0xb];
    auVar15[0xc] = (bVar5 >> 4 & 1) * auVar14[0xc];
    auVar15[0xd] = (bVar5 >> 5 & 1) * auVar14[0xd];
    auVar15[0xe] = (bVar5 >> 6 & 1) * auVar14[0xe];
    auVar15[0xf] = -((char)bVar5 >> 7) * auVar14[0xf];
    auVar14._4_4_ = local_98[1];
    auVar14._0_4_ = local_98[0];
    auVar14._8_4_ = local_98[2];
    auVar14._12_4_ = local_98[3];
    auVar14 = vmovdqu8_avx512vl(auVar15 ^ auVar14);
    *(undefined1 (*) [16])(m + uVar12) = auVar14;
    memcpy(local_98,c + uVar12 + 0x10,__n_00);
    puVar9 = (uint *)((long)local_98 + __n_00);
  }
  *(byte *)puVar9 = (byte)*puVar9 ^ 1;
  local_98[3] = local_98[3] ^ 0x80000000;
  gimli_core_u8((uint8_t *)local_98,'\x02');
  hydro_kx_aead_final((uint8_t *)local_98,local_58);
  lVar10 = 0;
  uVar8 = 0;
  do {
    puVar9 = local_88 + lVar10;
    lVar2 = lVar10 * 4;
    lVar10 = lVar10 + 1;
    uVar8 = uVar8 | *puVar9 ^ *(uint *)((long)&local_68 + lVar2);
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    local_98[lVar10] = 0;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0xc);
  if (uVar8 == 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = -1;
    if (__n != 0) {
      memset(m,0,__n);
    }
  }
  return iVar11;
}

Assistant:

static int
hydro_kx_aead_decrypt(hydro_kx_state *state, uint8_t *m, const uint8_t *c, size_t clen)
{
    _hydro_attr_aligned_(16) uint32_t int_state[gimli_BLOCKBYTES / 4];
    uint32_t                          pub_mac[hydro_kx_AEAD_MACBYTES / 4];
    uint8_t                           k[hydro_kx_AEAD_KEYBYTES];
    uint8_t                          *aead_state = (uint8_t *) (void *) int_state;
    const uint8_t                    *mac;
    const uint8_t                    *ct;
    size_t                            mlen;
    uint32_t                          cv;

    if (clen < hydro_kx_AEAD_MACBYTES) {
        return -1;
    }
    mac  = &c[0];
    ct   = &c[hydro_kx_AEAD_MACBYTES];
    mlen = clen - hydro_kx_AEAD_MACBYTES;
    memcpy(pub_mac, mac, sizeof pub_mac);
    hydro_kx_aead_init(aead_state, k, state);
    hydro_hash_update(&state->h_st, c, clen);
    hydro_kx_aead_xor_dec(aead_state, m, ct, mlen);
    hydro_kx_aead_final(aead_state, k);
    COMPILER_ASSERT(hydro_kx_AEAD_MACBYTES <= gimli_CAPACITY);
    COMPILER_ASSERT(gimli_RATE % 4 == 0);
    cv = hydro_mem_ct_cmp_u32(int_state + gimli_RATE / 4, pub_mac, hydro_kx_AEAD_MACBYTES / 4);
    hydro_mem_ct_zero_u32(int_state, gimli_BLOCKBYTES / 4);
    if (cv != 0) {
        mem_zero(m, mlen);
        return -1;
    }
    return 0;
}